

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS ref_import_fgrid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_CELL pRVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  ulong global;
  REF_INT ntri;
  REF_INT nnode;
  REF_INT nodes [4];
  REF_INT ntet;
  REF_INT new_cell;
  REF_INT face_id;
  REF_INT new_tri;
  REF_INT new_node;
  REF_DBL xyz;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_64;
  REF_GRID_conflict local_60;
  int local_58;
  REF_INT local_54;
  int local_50;
  uint local_4c;
  long local_48;
  long local_40;
  undefined8 local_38;
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0xab
             ,"ref_import_fgrid","unable to open file");
      uVar3 = 2;
    }
    else {
      iVar4 = __isoc99_fscanf(__stream,"%d",&local_7c);
      if (iVar4 == 1) {
        iVar4 = __isoc99_fscanf(__stream,"%d",&local_80);
        if (iVar4 == 1) {
          iVar4 = __isoc99_fscanf(__stream,"%d",&local_64);
          if (iVar4 == 1) {
            local_60 = pRVar1;
            if (0 < local_7c) {
              global = 0;
              do {
                uVar3 = ref_node_add(ref_node,global,(REF_INT *)&local_4c);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0xb2,"ref_import_fgrid",(ulong)uVar3,"new_node");
                  return uVar3;
                }
                if (global != local_4c) {
                  pcVar8 = "node index";
                  uVar6 = 0xb3;
                  goto LAB_0011a804;
                }
                global = global + 1;
              } while ((long)global < (long)local_7c);
            }
            uVar3 = ref_node_initialize_n_global(ref_node,(long)local_7c);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0xb6,"ref_import_fgrid",(ulong)uVar3,"init glob");
              return uVar3;
            }
            local_48 = 0;
            lVar9 = 0;
            do {
              local_40 = lVar9;
              if (0 < local_7c) {
                lVar7 = 0;
                lVar9 = local_48;
                do {
                  iVar4 = __isoc99_fscanf(__stream,"%lf",&local_38);
                  if (iVar4 != 1) {
                    pcVar8 = "xyz";
                    uVar6 = 0xba;
                    goto LAB_0011a804;
                  }
                  *(undefined8 *)((long)ref_node->real + lVar9) = local_38;
                  lVar7 = lVar7 + 1;
                  lVar9 = lVar9 + 0x78;
                } while (lVar7 < local_7c);
              }
              lVar9 = local_40 + 1;
              local_48 = local_48 + 8;
            } while (lVar9 != 3);
            pRVar2 = local_60->cell[3];
            local_6c = -1;
            if (0 < local_80) {
              iVar4 = 0;
              do {
                lVar9 = 0;
                do {
                  iVar5 = __isoc99_fscanf(__stream,"%d",(long)&local_78 + lVar9);
                  if (iVar5 != 1) {
                    pcVar8 = "tri";
                    uVar6 = 0xc2;
                    goto LAB_0011a804;
                  }
                  lVar9 = lVar9 + 4;
                } while (lVar9 != 0xc);
                local_78 = local_78 + -1;
                local_74 = local_74 + -1;
                local_70 = local_70 + -1;
                uVar3 = ref_cell_add(pRVar2,&local_78,&local_50);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0xc6,"ref_import_fgrid",(ulong)uVar3,"new tri");
                  return uVar3;
                }
                if (iVar4 != local_50) {
                  pcVar8 = "tri index";
                  uVar6 = 199;
                  goto LAB_0011a804;
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_80);
            }
            if (0 < local_80) {
              pRVar2 = local_60->cell[3];
              iVar4 = 0;
              do {
                iVar5 = __isoc99_fscanf(__stream,"%d",&local_54);
                if (iVar5 != 1) {
                  pcVar8 = "tri id";
                  uVar6 = 0xcc;
                  goto LAB_0011a804;
                }
                pRVar2->c2n[(long)pRVar2->size_per * (long)iVar4 + 3] = local_54;
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_80);
            }
            if (0 < local_64) {
              pRVar2 = local_60->cell[8];
              iVar4 = 0;
              do {
                lVar9 = 0;
                do {
                  iVar5 = __isoc99_fscanf(__stream,"%d",(long)&local_78 + lVar9);
                  if (iVar5 != 1) {
                    pcVar8 = "tet";
                    uVar6 = 0xd3;
                    goto LAB_0011a804;
                  }
                  lVar9 = lVar9 + 4;
                } while (lVar9 != 0x10);
                local_78 = local_78 + -1;
                local_74 = local_74 + -1;
                local_70 = local_70 + -1;
                local_6c = local_6c + -1;
                uVar3 = ref_cell_add(pRVar2,&local_78,&local_58);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0xd8,"ref_import_fgrid",(ulong)uVar3,"new tet");
                  return uVar3;
                }
                if (iVar4 != local_58) {
                  pcVar8 = "tet index";
                  uVar6 = 0xd9;
                  goto LAB_0011a804;
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_64);
            }
            fclose(__stream);
            return 0;
          }
          pcVar8 = "ntet";
          uVar6 = 0xaf;
        }
        else {
          pcVar8 = "ntri";
          uVar6 = 0xae;
        }
      }
      else {
        pcVar8 = "nnode";
        uVar6 = 0xad;
      }
LAB_0011a804:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar6,"ref_import_fgrid",pcVar8);
      uVar3 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0xa5,
           "ref_import_fgrid",(ulong)uVar3,"create grid");
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_import_fgrid(REF_GRID *ref_grid_ptr,
                                           REF_MPI ref_mpi,
                                           const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  REF_INT nnode, ntri, ntet;
  REF_INT ixyz, node, new_node;
  REF_DBL xyz;
  REF_INT tri, new_tri;
  REF_INT nodes[4];
  REF_INT face_id;
  REF_INT cell, new_cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RES(1, fscanf(file, "%d", &nnode), "nnode");
  RES(1, fscanf(file, "%d", &ntri), "ntri");
  RES(1, fscanf(file, "%d", &ntet), "ntet");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_add(ref_node, node, &new_node), "new_node");
    RES(node, new_node, "node index");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  for (ixyz = 0; ixyz < 3; ixyz++)
    for (node = 0; node < nnode; node++) {
      RES(1, fscanf(file, "%lf", &xyz), "xyz");
      ref_node_xyz(ref_node, ixyz, node) = xyz;
    }

  ref_cell = ref_grid_tri(ref_grid);
  nodes[3] = REF_EMPTY;
  for (tri = 0; tri < ntri; tri++) {
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_tri), "new tri");
    RES(tri, new_tri, "tri index");
  }

  ref_cell = ref_grid_tri(ref_grid);
  for (tri = 0; tri < ntri; tri++) {
    RES(1, fscanf(file, "%d", &face_id), "tri id");
    ref_cell_c2n(ref_cell, 3, tri) = face_id;
  }

  ref_cell = ref_grid_tet(ref_grid);
  for (cell = 0; cell < ntet; cell++) {
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tet");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new tet");
    RES(cell, new_cell, "tet index");
  }

  fclose(file);

  return REF_SUCCESS;
}